

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_XMLVariant * ParamHelper(ON_XMLVariant *__return_storage_ptr__,ON_XMLParameters *p,wchar_t *name)

{
  int iVar1;
  ON_XMLVariant local_110;
  
  ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  iVar1 = (*p->_vptr_ON_XMLParameters[6])(p,name,__return_storage_ptr__);
  if ((char)iVar1 == '\0') {
    ON_XMLVariant::ON_XMLVariant(&local_110,L"");
    ON_XMLVariant::operator=(__return_storage_ptr__,&local_110);
    ON_XMLVariant::~ON_XMLVariant(&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ParamHelper(const ON_XMLParameters& p, const wchar_t* name)
{
  ON_XMLVariant value;
  if (!p.GetParam(name, value))
    value = L"";

  return value;
}